

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateVirtualTableAssignment
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,TypeBase *type,
          FunctionData *function)

{
  ExprVariableAccess *this;
  ExprTypeLiteral *this_00;
  ExprTypeCast *this_01;
  ExprArrayIndex *this_02;
  TypeRef *type_00;
  ExprFunctionIndexLiteral *this_03;
  ExprAssignment *this_04;
  ExprBase *assignment;
  ExprBase *rhs;
  ExprArrayIndex *arraySlot;
  ExprBase *typeIdInt;
  ExprBase *typeId;
  ExprBase *vtableAccess;
  FunctionData *function_local;
  TypeBase *type_local;
  VariableData *vtable_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  this = ExpressionContext::get<ExprVariableAccess>(ctx);
  ExprVariableAccess::ExprVariableAccess(this,source,vtable->type,vtable);
  this_00 = ExpressionContext::get<ExprTypeLiteral>(ctx);
  ExprTypeLiteral::ExprTypeLiteral(this_00,source,ctx->typeTypeID,type);
  this_01 = ExpressionContext::get<ExprTypeCast>(ctx);
  ExprTypeCast::ExprTypeCast
            (this_01,source,ctx->typeInt,&this_00->super_ExprBase,EXPR_CAST_REINTERPRET);
  this_02 = ExpressionContext::get<ExprArrayIndex>(ctx);
  type_00 = ExpressionContext::GetReferenceType(ctx,ctx->typeFunctionID);
  ExprArrayIndex::ExprArrayIndex
            (this_02,source,&type_00->super_TypeBase,&this->super_ExprBase,&this_01->super_ExprBase)
  ;
  this_03 = ExpressionContext::get<ExprFunctionIndexLiteral>(ctx);
  ExprFunctionIndexLiteral::ExprFunctionIndexLiteral(this_03,source,ctx->typeFunctionID,function);
  this_04 = ExpressionContext::get<ExprAssignment>(ctx);
  ExprAssignment::ExprAssignment
            (this_04,source,ctx->typeFunctionID,&this_02->super_ExprBase,&this_03->super_ExprBase);
  return &this_04->super_ExprBase;
}

Assistant:

ExprBase* CreateVirtualTableAssignment(ExpressionContext &ctx, SynBase *source, VariableData *vtable, TypeBase *type, FunctionData *function)
{
	ExprBase *vtableAccess = new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable);

	ExprBase *typeId = new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, type);

	ExprBase *typeIdInt = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeInt, typeId, EXPR_CAST_REINTERPRET);

	ExprArrayIndex *arraySlot = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(ctx.typeFunctionID), vtableAccess, typeIdInt);

	ExprBase *rhs = new (ctx.get<ExprFunctionIndexLiteral>()) ExprFunctionIndexLiteral(source, ctx.typeFunctionID, function);

	ExprBase *assignment = new (ctx.get<ExprAssignment>()) ExprAssignment(source, ctx.typeFunctionID, arraySlot, rhs);

	return assignment;
}